

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int __thiscall ncnn::Convolution::create_requantize_op(Convolution *this)

{
  float fVar1;
  int *piVar2;
  void *__ptr;
  long *plVar3;
  int iVar4;
  Layer *pLVar5;
  float *pfVar6;
  long lVar7;
  iterator iVar8;
  long lVar9;
  float scale_out;
  float scale_in;
  ParamDict pd;
  float local_638;
  float local_634;
  vector<float,std::allocator<float>> *local_630;
  Mat local_628;
  ModelBinFromMatArray local_5e0;
  ParamDict local_5d0;
  
  if (this->use_int8_requantize == false) {
    create_requantize_op();
    iVar4 = -1;
  }
  else {
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (&this->requantize_ops,(long)this->num_output);
    if (0 < this->num_output) {
      local_630 = (vector<float,std::allocator<float>> *)&this->requantize_scales;
      lVar9 = 0;
      do {
        pLVar5 = create_layer(0x3f);
        (this->requantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar9] = pLVar5;
        fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + lVar9 * 4);
        local_634 = (float)(~-(uint)(fVar1 == 0.0) &
                           (uint)(1.0 / (this->bottom_blob_int8_scale * fVar1)));
        local_638 = this->top_blob_int8_scale;
        ParamDict::ParamDict(&local_5d0);
        ParamDict::set(&local_5d0,0,local_634);
        ParamDict::set(&local_5d0,1,local_638);
        ParamDict::set(&local_5d0,2,this->bias_term);
        ParamDict::set(&local_5d0,3,1);
        pLVar5 = (this->requantize_ops).
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9];
        (*pLVar5->_vptr_Layer[2])(pLVar5,&local_5d0);
        local_628.allocator = (this->bias_data).allocator;
        local_628.packing = (this->bias_data).packing;
        local_628.elemsize = (this->bias_data).elemsize;
        local_628.data = (void *)(local_628.elemsize * lVar9 + (long)(this->bias_data).data);
        local_628.refcount = (int *)0x0;
        local_628.dims = 1;
        local_628.w = 1;
        local_628.h = 1;
        local_628.c = 1;
        local_628.cstep = 1;
        pLVar5 = (this->requantize_ops).
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9];
        ModelBinFromMatArray::ModelBinFromMatArray(&local_5e0,&local_628);
        (*pLVar5->_vptr_Layer[3])(pLVar5,&local_5e0);
        iVar8._M_current =
             (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pfVar6 = (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
        if (iVar8._M_current == pfVar6) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (local_630,iVar8,&local_634);
          iVar8._M_current =
               (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pfVar6 = (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar8._M_current = local_634;
          iVar8._M_current = iVar8._M_current + 1;
          (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current;
        }
        if (iVar8._M_current == pfVar6) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (local_630,iVar8,&local_638);
        }
        else {
          *iVar8._M_current = local_638;
          (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        if (local_628.refcount != (int *)0x0) {
          LOCK();
          *local_628.refcount = *local_628.refcount + -1;
          UNLOCK();
          if (*local_628.refcount == 0) {
            if (local_628.allocator == (Allocator *)0x0) {
              if (local_628.data != (void *)0x0) {
                free(local_628.data);
              }
            }
            else {
              (**(code **)(*(long *)local_628.allocator + 0x18))();
            }
          }
        }
        lVar7 = 0x560;
        do {
          piVar2 = *(int **)((long)&local_5d0.params[0].v.data + lVar7);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              __ptr = *(void **)((long)&local_5d0.params[0].loaded + lVar7);
              plVar3 = *(long **)((long)&local_5d0.params[0].v.packing + lVar7);
              if (plVar3 == (long *)0x0) {
                if (__ptr != (void *)0x0) {
                  free(__ptr);
                }
              }
              else {
                (**(code **)(*plVar3 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar7 + 4) = 0;
          *(undefined8 *)((long)&local_5d0.params[0].v.refcount + lVar7 + 4) = 0;
          *(undefined8 *)((long)&local_5d0.params[0].loaded + lVar7) = 0;
          *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar7) = 0;
          *(undefined8 *)((long)&local_5d0.params[0].v.allocator + lVar7) = 0;
          *(undefined8 *)((long)&local_5d0.params[0].v.dims + lVar7) = 0;
          *(undefined8 *)((long)&local_5d0.params[0].v.h + lVar7) = 0;
          lVar7 = lVar7 + -0x48;
        } while (lVar7 != -0x40);
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->num_output);
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Convolution::create_requantize_op(void)
{
    if (!use_int8_requantize)
    {
        fprintf(stderr, "requantized op set but use_int8_requantize disabled\n");
        return -1;
    }

    requantize_ops.resize(num_output);
    for (int n=0; n<num_output; n++)
    {
        requantize_ops[n] = ncnn::create_layer(ncnn::LayerType::Requantize);

        float scale_in = 1.f;
        float scale_out = 1.f;

        if (weight_data_int8_scales[n] == 0)
        {
            scale_in = 0;
        }
        else
        {
            scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[n]);
        }

        scale_out = top_blob_int8_scale;

        ncnn::ParamDict pd;
        pd.set(0, scale_in);   // scale in
        pd.set(1, scale_out);  // scale_out
        pd.set(2, bias_term);  // bias_term
        pd.set(3, 1);          // bias_data_size

        requantize_ops[n]->load_param(pd);

        ncnn::Mat weights[1];
        weights[0] = bias_data.range(n, 1);

        requantize_ops[n]->load_model(ModelBinFromMatArray(weights));

        requantize_scales.push_back(scale_in);
        requantize_scales.push_back(scale_out);
    }

    return 0;
}